

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

int writeRandomBytes_dev_urandom(void *target,size_t count)

{
  int __fd;
  ssize_t sVar1;
  int *piVar2;
  bool bVar3;
  ssize_t bytesWrittenMore;
  size_t bytesToWrite;
  void *currentTarget;
  ulong uStack_30;
  int fd;
  size_t bytesWrittenTotal;
  int success;
  size_t count_local;
  void *target_local;
  
  bytesWrittenTotal._4_4_ = 0;
  uStack_30 = 0;
  __fd = open("/dev/urandom",0);
  if (__fd < 0) {
    target_local._4_4_ = 0;
  }
  else {
    do {
      sVar1 = read(__fd,(void *)((long)target + uStack_30),count - uStack_30);
      if ((0 < sVar1) && (uStack_30 = sVar1 + uStack_30, count <= uStack_30)) {
        bytesWrittenTotal._4_4_ = 1;
      }
      bVar3 = false;
      if (bytesWrittenTotal._4_4_ == 0) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    close(__fd);
    target_local._4_4_ = bytesWrittenTotal._4_4_;
  }
  return target_local._4_4_;
}

Assistant:

static int
writeRandomBytes_dev_urandom(void *target, size_t count) {
  int success = 0; /* full count bytes written? */
  size_t bytesWrittenTotal = 0;

  const int fd = open("/dev/urandom", O_RDONLY);
  if (fd < 0) {
    return 0;
  }

  do {
    void *const currentTarget = (void *)((char *)target + bytesWrittenTotal);
    const size_t bytesToWrite = count - bytesWrittenTotal;

    const ssize_t bytesWrittenMore = read(fd, currentTarget, bytesToWrite);

    if (bytesWrittenMore > 0) {
      bytesWrittenTotal += bytesWrittenMore;
      if (bytesWrittenTotal >= count)
        success = 1;
    }
  } while (! success && (errno == EINTR));

  close(fd);
  return success;
}